

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O0

void readHeader(char *fileName)

{
  int iVar1;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar2;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *pTVar3;
  ostream *poVar4;
  string *psVar5;
  char *in_RDI;
  M44fAttribute *cameraTransform;
  char *in_stack_00000068;
  Header *in_stack_00000070;
  StringAttribute *comments;
  RgbaInputFile file;
  RgbaInputFile local_48 [72];
  
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile(local_48,in_RDI,iVar1);
  Imf_3_2::RgbaInputFile::header();
  pTVar2 = Imf_3_2::Header::findTypedAttribute<Imf_3_2::TypedAttribute<std::__cxx11::string>>
                     (in_stack_00000070,in_stack_00000068);
  Imf_3_2::RgbaInputFile::header();
  pTVar3 = Imf_3_2::Header::findTypedAttribute<Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<float>>>
                     (in_stack_00000070,in_stack_00000068);
  if (pTVar2 != (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"comments\n   ");
    psVar5 = (string *)Imf_3_2::TypedAttribute<std::__cxx11::string>::value();
    poVar4 = std::operator<<(poVar4,psVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if (pTVar3 != (TypedAttribute<Imath_3_2::Matrix44<float>_> *)0x0) {
    std::operator<<((ostream *)&std::cout,"cameraTransform\n");
    Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<float>>::value();
    poVar4 = Imath_3_2::operator<<(_file,(Matrix44<float> *)comments);
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile(local_48);
  return;
}

Assistant:

void
readHeader (const char fileName[])
{
    //
    // Read an image's header from a file, and if the header
    // contains comments and camera transformation attributes,
    // print the values of those attributes.
    //
    //	- open the file
    //	- get the file header
    //	- look for the attributes
    //

    RgbaInputFile file (fileName);

    const StringAttribute* comments =
        file.header ().findTypedAttribute<StringAttribute> ("comments");

    const M44fAttribute* cameraTransform =
        file.header ().findTypedAttribute<M44fAttribute> ("cameraTransform");

    if (comments) cout << "comments\n   " << comments->value () << endl;

    if (cameraTransform)
        cout << "cameraTransform\n" << cameraTransform->value () << flush;
}